

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_ISTORE(JitCompilerX86 *this,Instruction *instr,int i)

{
  long in_RSI;
  JitCompilerX86 *in_RDI;
  Instruction *in_stack_ffffffffffffffd8;
  
  genAddressRegDst(in_RDI,in_stack_ffffffffffffffd8);
  emit<2ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
  emitByte(in_RDI,*(char *)(in_RSI + 2) * '\b' + '\x04');
  emitByte(in_RDI,'\x06');
  return;
}

Assistant:

void JitCompilerX86::h_ISTORE(Instruction& instr, int i) {
		genAddressRegDst(instr);
		emit(REX_MOV_MR);
		emitByte(0x04 + 8 * instr.src);
		emitByte(0x06);
	}